

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O3

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::reset
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Manager_type p_Var2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar3 == 0) {
    p_Var1 = (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    this->code_ = OK;
    this->has_result_ = false;
    this->accepted_ = false;
    p_Var2 = (this->handler_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->handler_,(_Any_data *)&this->handler_,__destroy_functor);
      (this->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->handler_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var2 = (this->handler2_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->handler2_,(_Any_data *)&this->handler2_,__destroy_functor);
      (this->handler2_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->handler2_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var1 = (this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> guard(lock_);
        err_ = TE();
        code_ = cmd_result_code::OK;
        has_result_ = false;
        accepted_ = false;
        handler_ = nullptr;
        handler2_ = nullptr;
        result_ = T();
    }